

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_add_input_at(wally_psbt *psbt,uint32_t index,uint32_t flags,wally_tx_input *input)

{
  int local_fc;
  undefined1 local_f8 [4];
  int ret;
  wally_tx_input tmp;
  wally_tx_input *input_local;
  uint32_t flags_local;
  uint32_t index_local;
  wally_psbt *psbt_local;
  
  if (((((psbt == (wally_psbt *)0x0) || (psbt->tx == (wally_tx *)0x0)) ||
       (psbt->tx->num_inputs != psbt->num_inputs)) ||
      (((flags & 0xfffffffe) != 0 || (psbt->num_inputs < (ulong)index)))) ||
     (input == (wally_tx_input *)0x0)) {
    psbt_local._4_4_ = -2;
  }
  else {
    tmp.pegin_witness = (wally_tx_witness_stack *)input;
    memcpy(local_f8,input,0xd0);
    if ((flags & 1) != 0) {
      tmp.index = 0;
      tmp.sequence = 0;
      tmp.script = (uchar *)0x0;
      tmp.script_len = 0;
    }
    local_fc = wally_tx_add_input_at(psbt->tx,index,(wally_tx_input *)local_f8);
    wally_clear(local_f8,0xd0);
    if (local_fc == 0) {
      if ((psbt->inputs_allocation_len <= psbt->num_inputs) &&
         (local_fc = array_grow(&psbt->inputs,psbt->num_inputs,&psbt->inputs_allocation_len,0x110),
         local_fc != 0)) {
        wally_tx_remove_input(psbt->tx,(ulong)index);
        return local_fc;
      }
      memmove(psbt->inputs + (ulong)index + 1,psbt->inputs + index,
              (psbt->num_inputs - (ulong)index) * 0x110);
      wally_clear(psbt->inputs + index,0x110);
      psbt->num_inputs = psbt->num_inputs + 1;
    }
    psbt_local._4_4_ = local_fc;
  }
  return psbt_local._4_4_;
}

Assistant:

int wally_psbt_add_input_at(struct wally_psbt *psbt,
                            uint32_t index, uint32_t flags,
                            const struct wally_tx_input *input)
{
    struct wally_tx_input tmp;
    int ret;

    if (!psbt || !psbt->tx || psbt->tx->num_inputs != psbt->num_inputs ||
        (flags & ~WALLY_PSBT_FLAG_NON_FINAL) ||
        index > psbt->num_inputs || !input)
        return WALLY_EINVAL;

    memcpy(&tmp, input, sizeof(tmp));
    if (flags & WALLY_PSBT_FLAG_NON_FINAL) {
        /* Clear scriptSig and witness before adding */
        tmp.script = NULL;
        tmp.script_len = 0;
        tmp.witness = NULL;
    }
    ret = wally_tx_add_input_at(psbt->tx, index, &tmp);
    wally_clear(&tmp, sizeof(tmp));

    if (ret == WALLY_OK) {
        if (psbt->num_inputs >= psbt->inputs_allocation_len) {
            ret = array_grow((void *)&psbt->inputs, psbt->num_inputs,
                             &psbt->inputs_allocation_len,
                             sizeof(struct wally_psbt_input));
            if (ret != WALLY_OK) {
                wally_tx_remove_input(psbt->tx, index);
                return ret;
            }
        }

        memmove(psbt->inputs + index + 1, psbt->inputs + index,
                (psbt->num_inputs - index) * sizeof(struct wally_psbt_input));
        wally_clear(psbt->inputs + index, sizeof(struct wally_psbt_input));
        psbt->num_inputs += 1;
    }
    return ret;
}